

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

string * __thiscall pbrt::CameraBase::ToString_abi_cxx11_(CameraBase *this)

{
  bool bVar1;
  Vector3<float> *unaff_RBX;
  Vector3<float> *in_RSI;
  string *in_RDI;
  Vector3<float> *unaff_retaddr;
  char **local_90;
  string *this_00;
  float *args_3;
  Vector3<float> *args_2;
  float *args_1;
  CameraTransform *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  string local_40 [32];
  string *args_6;
  
  args_3 = &in_RSI[0x44].super_Tuple3<pbrt::Vector3,_float>.z;
  args_2 = in_RSI + 0x45;
  args_1 = &in_RSI[0x45].super_Tuple3<pbrt::Vector3,_float>.y;
  this_00 = in_RDI;
  args_6 = in_RDI;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 0x46));
  if (bVar1) {
    Medium::ToString_abi_cxx11_((Medium *)this_00);
    local_90 = (char **)std::__cxx11::string::c_str();
  }
  else {
    local_90 = (char **)0xa73f71;
  }
  StringPrintf<pbrt::CameraTransform_const&,float_const&,float_const&,pbrt::Film_const&,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,args_1,(float *)args_2,
             (Film *)args_3,local_90,in_RSI,(Vector3<float> *)args_6,unaff_RBX,unaff_retaddr);
  if (bVar1) {
    std::__cxx11::string::~string(local_40);
  }
  return in_RDI;
}

Assistant:

std::string CameraBase::ToString() const {
    return StringPrintf("cameraTransform: %s shutterOpen: %f shutterClose: %f film: %s "
                        "medium: %s minPosDifferentialX: %s minPosDifferentialY: %s "
                        "minDirDifferentialX: %s minDirDifferentialY: %s ",
                        cameraTransform, shutterOpen, shutterClose, film,
                        medium ? medium.ToString().c_str() : "(nullptr)",
                        minPosDifferentialX, minPosDifferentialY, minDirDifferentialX,
                        minDirDifferentialY);
}